

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::matrix2d>
          (Attribute *this,double t,matrix2d *dst,TimeSampleInterpolationType tinterp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  value_type *pvVar5;
  optional<tinyusdz::value::matrix2d> v;
  optional<tinyusdz::value::matrix2d> local_78;
  optional<tinyusdz::value::matrix2d> local_50;
  
  if (dst == (matrix2d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar4 = primvar::PrimVar::has_value(&this->_var);
    if (bVar4) {
      primvar::PrimVar::get_value<tinyusdz::value::matrix2d>(&local_78,&this->_var);
      local_50.has_value_ = local_78.has_value_;
      if (local_78.has_value_ != false) {
        local_50.contained._16_8_ = local_78.contained._16_8_;
        local_50.contained._24_8_ = local_78.contained._24_8_;
        local_50.contained.data.__align = local_78.contained.data.__align;
        local_50.contained._8_8_ = local_78.contained._8_8_;
        pvVar5 = nonstd::optional_lite::optional<tinyusdz::value::matrix2d>::value(&local_50);
        dVar1 = pvVar5->m[0][1];
        dVar2 = pvVar5->m[1][0];
        dVar3 = pvVar5->m[1][1];
        dst->m[0][0] = pvVar5->m[0][0];
        dst->m[0][1] = dVar1;
        dst->m[1][0] = dVar2;
        dst->m[1][1] = dVar3;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar4 = get_value<tinyusdz::value::matrix2d>(this,dst);
  }
  else {
    bVar4 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix2d>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar4;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }